

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int g_read(lua_State *L,FILE *f,int first)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  lconv *plVar11;
  ushort **ppuVar12;
  int idx;
  uint hex;
  bool bVar13;
  int local_474;
  luaL_Buffer local_450;
  
  iVar3 = lua_gettop(L);
  clearerr((FILE *)f);
  piVar7 = __errno_location();
  *piVar7 = 0;
  if (iVar3 == 1) {
    uVar4 = read_line(L,f,1);
    idx = first + 1;
  }
  else {
    luaL_checkstack(L,iVar3 + 0x13,"too many arguments");
    iVar3 = iVar3 + -2;
    idx = first;
    do {
      iVar5 = lua_type(L,idx);
      if (iVar5 == 3) {
        sVar8 = luaL_checkinteger(L,idx);
        if (sVar8 == 0) {
          iVar5 = getc((FILE *)f);
          ungetc(iVar5,(FILE *)f);
          lua_pushstring(L,"");
          bVar13 = iVar5 == -1;
        }
        else {
          luaL_buffinit(L,&local_450);
          pcVar9 = luaL_prepbuffsize(&local_450,sVar8);
          sVar10 = fread(pcVar9,1,sVar8,(FILE *)f);
          local_450.n = local_450.n + sVar10;
          luaL_pushresult(&local_450);
          bVar13 = sVar10 == 0;
        }
        uVar4 = (uint)!bVar13;
      }
      else {
        pcVar9 = luaL_checklstring(L,idx,(size_t *)0x0);
        bVar1 = pcVar9[*pcVar9 == '*'];
        if (bVar1 < 0x6c) {
          if (bVar1 == 0x4c) {
            iVar5 = 0;
LAB_00116220:
            uVar4 = read_line(L,f,iVar5);
            goto LAB_00116332;
          }
          if (bVar1 == 0x61) {
            luaL_buffinit(L,&local_450);
            do {
              pcVar9 = luaL_prepbuffsize(&local_450,0x400);
              sVar10 = fread(pcVar9,1,0x400,(FILE *)f);
              local_450.n = local_450.n + sVar10;
            } while (sVar10 == 0x400);
            luaL_pushresult(&local_450);
            bVar13 = true;
            uVar4 = 1;
          }
          else {
LAB_001161ea:
            local_474 = luaL_argerror(L,idx,"invalid format");
            uVar4 = 1;
            bVar13 = false;
          }
        }
        else {
          if (bVar1 == 0x6c) {
            iVar5 = 1;
            goto LAB_00116220;
          }
          if (bVar1 != 0x6e) goto LAB_001161ea;
          local_450.size._4_4_ = 0;
          local_450.b = (char *)f;
          plVar11 = localeconv();
          cVar2 = *plVar11->decimal_point;
          flockfile((FILE *)local_450.b);
          do {
            uVar4 = getc_unlocked((FILE *)local_450.b);
            local_450.size._0_4_ = uVar4;
            ppuVar12 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar12 + (long)(int)uVar4 * 2 + 1) & 0x20) != 0);
          if ((uVar4 == 0x2d) || (uVar4 == 0x2b)) {
            nextc((RN *)&local_450);
          }
          uVar4 = 0;
          if ((uint)local_450.size == 0x30) {
            iVar5 = nextc((RN *)&local_450);
            pcVar9 = "eE";
            hex = 0;
            if (iVar5 != 0) {
              if (((uint)local_450.size | 0x20) == 0x78) {
                iVar5 = nextc((RN *)&local_450);
                bVar13 = iVar5 == 0;
              }
              else {
                bVar13 = true;
              }
              uVar4 = (uint)bVar13;
              pcVar9 = "pP";
              if (bVar13 != false) {
                pcVar9 = "eE";
              }
              hex = (uint)(bVar13 ^ 1);
            }
          }
          else {
            pcVar9 = "eE";
            hex = 0;
          }
          iVar5 = readdigits((RN *)&local_450,hex);
          iVar5 = iVar5 + uVar4;
          if (((uint)local_450.size == (int)cVar2 || (uint)local_450.size == 0x2e) &&
             (iVar6 = nextc((RN *)&local_450), iVar6 != 0)) {
            iVar6 = readdigits((RN *)&local_450,hex);
            iVar5 = iVar5 + iVar6;
          }
          if ((0 < iVar5) &&
             ((((uint)local_450.size == (int)*pcVar9 || ((uint)local_450.size == (int)pcVar9[1])) &&
              (iVar5 = nextc((RN *)&local_450), iVar5 != 0)))) {
            if (((uint)local_450.size == 0x2d) || ((uint)local_450.size == 0x2b)) {
              nextc((RN *)&local_450);
            }
            readdigits((RN *)&local_450,0);
          }
          ungetc((uint)local_450.size,(FILE *)local_450.b);
          funlockfile((FILE *)local_450.b);
          *(undefined1 *)((long)&local_450.n + (long)local_450.size._4_4_) = 0;
          sVar8 = lua_stringtonumber(L,(char *)&local_450.n);
          uVar4 = 1;
          if (sVar8 == 0) {
            lua_pushnil(L);
            uVar4 = 0;
          }
LAB_00116332:
          bVar13 = true;
        }
        if (!bVar13) {
          return local_474;
        }
      }
      idx = idx + 1;
      bVar13 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((bVar13) && (uVar4 != 0));
  }
  iVar3 = ferror((FILE *)f);
  if (iVar3 == 0) {
    if (uVar4 == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    local_474 = idx - first;
  }
  else {
    local_474 = luaL_fileresult(L,0,(char *)0x0);
  }
  return local_474;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int n, success;
  clearerr(f);
  errno = 0;
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first + 1;  /* to return 1 result */
  }
  else {
    /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    luaL_pushfail(L);  /* push nil instead */
  }
  return n - first;
}